

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O3

FState * FindState(int statenum)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  if ((statenum != 0) && ((ulong)StateMap.Count != 0)) {
    iVar2 = 1;
    lVar4 = 0;
    do {
      if (statenum < iVar2) {
        iVar3 = iVar2 + *(int *)((long)&(StateMap.Array)->StateSpan + lVar4);
      }
      else {
        iVar3 = *(int *)((long)&(StateMap.Array)->StateSpan + lVar4) + iVar2;
        if (statenum < iVar3) {
          lVar1 = *(long *)((long)&(StateMap.Array)->State + lVar4);
          if (lVar1 != 0) {
            if ((&(StateMap.Array)->OwnerIsPickup)[lVar4] == true) {
              PushTouchedActor(*(PClassActor **)((long)&(StateMap.Array)->Owner + lVar4));
              lVar1 = *(long *)((long)&(StateMap.Array)->State + lVar4);
            }
            return (FState *)(lVar1 + (long)statenum * 0x28 + (long)iVar2 * -0x28);
          }
          return (FState *)0x0;
        }
      }
      iVar2 = iVar3;
      lVar4 = lVar4 + 0x20;
    } while ((ulong)StateMap.Count << 5 != lVar4);
    return (FState *)0x0;
  }
  return (FState *)0x0;
}

Assistant:

static FState *FindState (int statenum)
{
	int stateacc;
	unsigned i;

	if (statenum == 0)
		return NULL;

	for (i = 0, stateacc = 1; i < StateMap.Size(); i++)
	{
		if (stateacc <= statenum && stateacc + StateMap[i].StateSpan > statenum)
		{
			if (StateMap[i].State != NULL)
			{
				if (StateMap[i].OwnerIsPickup)
				{
					PushTouchedActor(StateMap[i].Owner);
				}
				return StateMap[i].State + statenum - stateacc;
			}
			else return NULL;
		}
		stateacc += StateMap[i].StateSpan;
	}
	return NULL;
}